

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

pointer __thiscall
google::protobuf::RepeatedField<double>::AddNAlreadyReserved(RepeatedField<double> *this,int n)

{
  ulong uVar1;
  int v;
  int iVar2;
  char *pcVar3;
  LogMessage *this_00;
  string *psVar4;
  LogMessageFatal local_38 [16];
  
  uVar1 = (this->soo_rep_).field_0.long_rep.elements_int;
  v = internal::SooRep::size(&this->soo_rep_,(uVar1 & 4) == 0);
  iVar2 = 1;
  if ((uVar1 & 4) != 0) {
    iVar2 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (iVar2 - v < n) {
    psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)(iVar2 - v),(long)n,"capacity - old_size >= n");
  }
  else {
    psVar4 = (string *)0x0;
  }
  if (psVar4 == (string *)0x0) {
    if ((uVar1 & 4) == 0) {
      pcVar3 = (char *)((long)&(this->soo_rep_).field_0 + 8);
    }
    else {
      pcVar3 = internal::LongSooRep::elements((LongSooRep *)this);
    }
    iVar2 = internal::SooRep::size(&this->soo_rep_,(uVar1 & 4) == 0);
    if ((iVar2 != v + n) &&
       ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
        (undefined1  [16])0x0)) {
      internal::LongSooRep::elements((LongSooRep *)this);
    }
    set_size(this,(uVar1 & 4) == 0,v + n);
    return (pointer)(pcVar3 + (long)iVar2 * 8);
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
             ,0x306,*(undefined8 *)(psVar4 + 8),*(undefined8 *)psVar4);
  this_00 = (LogMessage *)
            _ZN4absl12lts_2024072212log_internal10LogMessagelsIiTnNSt9enable_ifIXntsr4absl16HasAbslStringifyIT_EE5valueEiE4typeELi0EEERS2_RKS5_
                      (local_38);
  absl::lts_20240722::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>(this_00,2,", ");
  absl::lts_20240722::log_internal::LogMessage::operator<<(this_00,v);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
}

Assistant:

inline Element* RepeatedField<Element>::AddNAlreadyReserved(int n)
    ABSL_ATTRIBUTE_LIFETIME_BOUND {
  const bool is_soo = this->is_soo();
  const int old_size = size(is_soo);
  ABSL_ATTRIBUTE_UNUSED const int capacity = Capacity(is_soo);
  ABSL_DCHECK_GE(capacity - old_size, n) << capacity << ", " << old_size;
  Element* p =
      unsafe_elements(is_soo) + ExchangeCurrentSize(is_soo, old_size + n);
  for (Element *begin = p, *end = p + n; begin != end; ++begin) {
    new (static_cast<void*>(begin)) Element;
  }
  return p;
}